

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pools.cpp
# Opt level: O0

void __thiscall xmrig::Pools::load(Pools *this,IJsonReader *reader)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  int iVar4;
  Pool *this_00;
  Pool *pPVar5;
  long *in_RSI;
  Pools *in_RDI;
  Pool pool;
  Value *value;
  ValueIterator __end1;
  ValueIterator __begin1;
  ConstArray *__range1;
  Value *pools;
  value_type *in_stack_fffffffffffffec8;
  undefined6 in_stack_fffffffffffffed0;
  Value *in_stack_ffffffffffffffc8;
  GenericArray<true,_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
  local_28;
  GenericArray<true,_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
  *local_20;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *local_18;
  long *local_10;
  
  local_10 = in_RSI;
  std::vector<xmrig::Pool,_std::allocator<xmrig::Pool>_>::clear
            ((vector<xmrig::Pool,_std::allocator<xmrig::Pool>_> *)0x1d16fd);
  local_18 = (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)(**(code **)(*local_10 + 0x28))(local_10,"pools");
  bVar1 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::IsArray(local_18);
  if (bVar1) {
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    GetArray((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)in_stack_fffffffffffffec8);
    local_20 = &local_28;
    this_00 = (Pool *)rapidjson::
                      GenericArray<true,_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
                      ::begin((GenericArray<true,_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
                               *)0x1d1764);
    pPVar5 = (Pool *)rapidjson::
                     GenericArray<true,_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
                     ::end((GenericArray<true,_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
                            *)0x1d1785);
    for (; this_00 != pPVar5; this_00 = (Pool *)&this_00->m_fingerprint) {
      uVar2 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::IsObject((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                          *)this_00);
      if ((bool)uVar2) {
        Pool::Pool(this_00,in_stack_ffffffffffffffc8);
        uVar3 = Pool::isValid((Pool *)0x1d1823);
        if ((bool)uVar3) {
          std::vector<xmrig::Pool,_std::allocator<xmrig::Pool>_>::push_back
                    ((vector<xmrig::Pool,_std::allocator<xmrig::Pool>_> *)
                     CONCAT17(uVar2,CONCAT16(uVar3,in_stack_fffffffffffffed0)),
                     in_stack_fffffffffffffec8);
        }
        Pool::~Pool((Pool *)CONCAT17(uVar2,CONCAT16(uVar3,in_stack_fffffffffffffed0)));
      }
    }
    rapidjson::
    GenericArray<true,_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
    ::~GenericArray(&local_28);
    iVar4 = (**(code **)(*local_10 + 0x40))(local_10,"retries",0);
    setRetries(in_RDI,iVar4);
    iVar4 = (**(code **)(*local_10 + 0x40))(local_10,"retry-pause",0);
    setRetryPause(in_RDI,iVar4);
  }
  return;
}

Assistant:

void xmrig::Pools::load(const IJsonReader &reader)
{
    m_data.clear();

    const rapidjson::Value &pools = reader.getArray("pools");
    if (!pools.IsArray()) {
        return;
    }

    for (const rapidjson::Value &value : pools.GetArray()) {
        if (!value.IsObject()) {
            continue;
        }

        Pool pool(value);
        if (pool.isValid()) {
            m_data.push_back(std::move(pool));
        }
    }

    setRetries(reader.getInt("retries"));
    setRetryPause(reader.getInt("retry-pause"));
}